

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

void Glucose_CheckTwoNodesTest(Gia_Man_t *p)

{
  int iVar1;
  int iLit1;
  SimpSolver *pSat;
  Gia_Obj_t *pGVar2;
  char *pcVar3;
  char *pcVar4;
  int fEquiv;
  
  pSat = glucose_solver_start();
  for (fEquiv = 0; fEquiv != 2; fEquiv = fEquiv + 1) {
    pGVar2 = Gia_ManPo(p,0);
    iVar1 = Gia_ObjFaninLit0p(p,pGVar2);
    pGVar2 = Gia_ManPo(p,1);
    iLit1 = Gia_ObjFaninLit0p(p,pGVar2);
    iVar1 = bmcg_sat_solver_equiv_overlap_check(pSat,p,iVar1,iLit1,fEquiv);
    (*(pSat->super_Solver)._vptr_Solver[2])(pSat);
    pcVar4 = "Equivalence";
    if (fEquiv == 0) {
      pcVar4 = "Overlap";
    }
    pcVar3 = "holds";
    if (iVar1 == 0) {
      pcVar3 = "fails";
    }
    printf("%s %s.\n",pcVar4,pcVar3);
  }
  (*(pSat->super_Solver)._vptr_Solver[1])(pSat);
  return;
}

Assistant:

void Glucose_CheckTwoNodesTest( Gia_Man_t * p )
{
    int n, Res;
    bmcg_sat_solver * pSat = bmcg_sat_solver_start();
    for ( n = 0; n < 2; n++ )
    {
        Res = bmcg_sat_solver_equiv_overlap_check( 
            pSat, p, 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 1)), 
            n );
        bmcg_sat_solver_reset( pSat );
        printf( "%s %s.\n", n ? "Equivalence" : "Overlap", Res ? "holds" : "fails" );
    }
    bmcg_sat_solver_stop( pSat );
}